

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_analyze.hpp
# Opt level: O3

unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>
duckdb::AlpRDInitAnalyze<double>(ColumnData *col_data,PhysicalType type)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  undefined7 in_register_00000031;
  
  p_Var1 = *(_func_int **)(CONCAT71(in_register_00000031,type) + 0x18);
  pp_Var2 = (_func_int **)operator_new(0x50a8);
  pp_Var2[1] = p_Var1;
  *pp_Var2 = (_func_int *)&PTR__AlpRDAnalyzeState_0246fed8;
  pp_Var2[2] = (_func_int *)0x0;
  pp_Var2[3] = (_func_int *)0x0;
  pp_Var2[4] = (_func_int *)0x0;
  pp_Var2[5] = (_func_int *)0x0;
  pp_Var2[6] = (_func_int *)0x0;
  pp_Var2[7] = (_func_int *)0x0;
  *(undefined4 *)(pp_Var2 + 8) = 0;
  pp_Var2[0xa0d] = (_func_int *)(pp_Var2 + 0xa13);
  pp_Var2[0xa0e] = (_func_int *)0x1;
  pp_Var2[0xa0f] = (_func_int *)0x0;
  pp_Var2[0xa10] = (_func_int *)0x0;
  *(undefined4 *)(pp_Var2 + 0xa11) = 0x3f800000;
  pp_Var2[0xa12] = (_func_int *)0x0;
  pp_Var2[0xa13] = (_func_int *)0x0;
  col_data->_vptr_ColumnData = pp_Var2;
  return (unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)
         (unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)col_data;
}

Assistant:

unique_ptr<AnalyzeState> AlpRDInitAnalyze(ColumnData &col_data, PhysicalType type) {
	CompressionInfo info(col_data.GetBlockManager());
	return make_uniq<AlpRDAnalyzeState<T>>(info);
}